

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O2

void __thiscall
so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::trace_extracted_demand
          (mchain_tracing_enabled_base *this,abstract_message_chain_t *chain,demand_t *d)

{
  composed_action_name local_10;
  
  local_10.m_1 = "service_request";
  if (d->m_demand_type == event) {
    local_10.m_1 = "message";
  }
  local_10.m_2 = "extracted";
  details::
  make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (this->m_tracer,chain,&local_10,&d->m_msg_type,&d->m_message_ref);
  return;
}

Assistant:

void
		trace_extracted_demand(
			const abstract_message_chain_t & chain,
			const mchain_props::demand_t & d )
			{
				details::make_trace(
						m_tracer,
						chain,
						details::composed_action_name{
								message_or_svc_request( d.m_demand_type ),
								"extracted" },
						d.m_msg_type,
						d.m_message_ref );
			}